

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O1

void handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>
               (request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                *req,send_lambda *send)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  verb vVar2;
  size_t sVar3;
  ulong uVar4;
  string_view query_00;
  int iVar5;
  void *pvVar6;
  pointer pcVar7;
  RestCommand command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type __rlen;
  size_t __n_00;
  pointer pcVar8;
  size_type __n;
  pointer __n_01;
  char *pcVar9;
  string_view target;
  string_view why;
  string_view why_00;
  string_view why_01;
  string_view body;
  string_view content_type;
  string_view content_type_00;
  string_view content_type_01;
  string_view target_00;
  string_view content_type_02;
  string_view content_type_03;
  string_view content_type_04;
  anon_class_8_1_ba1d73fe response_ok;
  string brokerName;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  reqpr;
  anon_class_8_1_ba1d73fe bad_request;
  string query;
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  res;
  string targetObj;
  anon_class_8_1_ba1d73fe not_found;
  anon_class_8_1_ba1d73fe local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [16];
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  local_170;
  anon_class_8_1_ba1d73fe local_158;
  response<http::string_body> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  anon_class_8_1_ba1d73fe local_68;
  string local_60;
  size_t local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_38;
  
  if ((handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
       ::index_page_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                                   ::index_page_abi_cxx11_), iVar5 != 0)) {
    generateIndexPage_abi_cxx11_();
    __cxa_atexit(std::__cxx11::string::~string,
                 &handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                  ::index_page_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                         ::index_page_abi_cxx11_);
  }
  vVar2 = (req->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
          method_;
  local_1a8.req = req;
  local_158.req = req;
  local_68.req = req;
  switch(vVar2) {
  case delete_:
    command = REMOVE;
    break;
  case get:
  case head:
  case search:
    command = QUERY;
    break;
  case post:
  case put:
    command = CREATE;
    break;
  default:
    why._M_str = "Unknown HTTP-method";
    why._M_len = 0x13;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_150,&local_158,why);
    HttpSession::send_lambda::operator()(send,&local_150);
    goto LAB_0022e542;
  case options:
    local_180._0_8_ = &local_170;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"{\"success\":true}","");
    content_type_01._M_str = "application/json";
    content_type_01._M_len = 0x10;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_150,&local_1a8,(string *)local_180,content_type_01)
    ;
    HttpSession::send_lambda::operator()(send,&local_150);
    goto LAB_0022e6e0;
  }
  sVar3 = (req->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
          super_basic_fields<std::allocator<char>_>.target_or_reason_._M_len;
  pcVar9 = (req->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
           super_basic_fields<std::allocator<char>_>.target_or_reason_._M_str + (sVar3 != 0);
  __n_00 = 0;
  if (sVar3 != 0) {
    __n_00 = sVar3 - 1;
  }
  uVar4 = (req->
          super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
          ).value_._M_string_length;
  if ((long)__n_00 < 0xb) {
    if (__n_00 == 1) {
      iVar5 = bcmp(pcVar9,"/",1);
      if ((iVar5 == 0) && (uVar4 < 4)) goto LAB_0022e510;
LAB_0022e41c:
      if (__n_00 == 0xb) goto LAB_0022e448;
      if (__n_00 == 0xc) goto LAB_0022e428;
    }
    else if ((__n_00 == 10) && (iVar5 = bcmp(pcVar9,"index.html",10), iVar5 == 0)) {
LAB_0022e510:
      content_type._M_str = "text/html";
      content_type._M_len = 9;
      handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
      ::anon_class_8_1_ba1d73fe::operator()
                (&local_150,&local_1a8,
                 &handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                  ::index_page_abi_cxx11_,content_type);
      HttpSession::send_lambda::operator()(send,&local_150);
LAB_0022e542:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.
             super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
             .value_._M_dataplus._M_p !=
          &local_150.
           super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
           .value_.field_2) {
        operator_delete(local_150.
                        super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                        .value_._M_dataplus._M_p,
                        local_150.
                        super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                        .value_.field_2._M_allocated_capacity + 1);
      }
      boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
                ((basic_fields<std::allocator<char>_> *)&local_150);
      return;
    }
  }
  else if (__n_00 == 0xc) {
LAB_0022e428:
    iVar5 = bcmp(pcVar9,"/healthcheck",__n_00);
    if (iVar5 == 0) {
LAB_0022e640:
      local_180._0_8_ = &local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"{\"success\":true}","");
      content_type_00._M_str = "application/json";
      content_type_00._M_len = 0x10;
      handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
      ::anon_class_8_1_ba1d73fe::operator()
                (&local_150,&local_1a8,(string *)local_180,content_type_00);
      HttpSession::send_lambda::operator()(send,&local_150);
LAB_0022e6e0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.
             super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
             .value_._M_dataplus._M_p !=
          &local_150.
           super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
           .value_.field_2) {
        operator_delete(local_150.
                        super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                        .value_._M_dataplus._M_p,
                        local_150.
                        super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                        .value_.field_2._M_allocated_capacity + 1);
      }
      boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
                ((basic_fields<std::allocator<char>_> *)&local_150);
      if ((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
           *)local_180._0_8_ == &local_170) {
        return;
      }
      operator_delete((void *)local_180._0_8_,
                      (ulong)((long)local_170.m_flat_tree.m_data.m_seq.m_holder.m_start + 1));
      return;
    }
    if (__n_00 == 0xb) {
LAB_0022e448:
      iVar5 = bcmp(pcVar9,"healthcheck",__n_00);
      if (iVar5 == 0) goto LAB_0022e640;
    }
  }
  else if (__n_00 == 0xb) {
    iVar5 = bcmp(pcVar9,"/index.html",0xb);
    if (iVar5 != 0) goto LAB_0022e41c;
    goto LAB_0022e510;
  }
  target._M_str = pcVar9;
  target._M_len = __n_00;
  body._M_str = (req->
                super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                ).value_._M_dataplus._M_p;
  body._M_len = (req->
                super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                ).value_._M_string_length;
  processRequestParameters_abi_cxx11_
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
              *)local_180,target,body);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  __n_01 = (pointer)local_180._0_8_;
  if ((pointer)local_180._0_8_ != (pointer)0x0) {
    __n_01 = (pointer)(local_180._0_8_ +
                      -(ulong)(((char *)(local_180._8_8_ + -1))[local_180._0_8_] == '/'));
  }
  pcVar9 = (char *)local_180._8_8_;
  if ((__n_01 != (pointer)0x0) && (*(char *)local_180._8_8_ == '/')) {
    pcVar9 = (char *)(local_180._8_8_ + 1);
    __n_01 = __n_01 + -1;
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  if (__n_01 == (pointer)0x0) {
    pcVar8 = (pointer)0xffffffffffffffff;
  }
  else {
    pvVar6 = memchr(pcVar9,0x2f,(size_t)__n_01);
    pcVar8 = (pointer)(-(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)pcVar9);
  }
  if (pcVar8 == (pointer)0xffffffffffffffff) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_1a0,0,0,pcVar9,(size_type)__n_01);
  }
  else {
    pcVar7 = pcVar8;
    if (__n_01 < pcVar8) {
      pcVar7 = __n_01;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_1a0,0,0,pcVar9,(size_type)pcVar7);
    pcVar7 = pcVar8 + 1;
    if (__n_01 <= pcVar8) {
LAB_0022eacb:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 pcVar7,__n_01);
    }
    pcVar9 = pcVar9 + (long)pcVar7;
    pcVar8 = (pointer)0xffffffffffffffff;
    __n_01 = __n_01 + -(long)pcVar7;
    if (__n_01 != (pointer)0x0) {
      pvVar6 = memchr(pcVar9,0x2f,(size_t)__n_01);
      pcVar8 = (pointer)(-(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)pcVar9);
    }
    if (pcVar8 == (pointer)0xffffffffffffffff) {
      this = &local_88;
    }
    else {
      pcVar7 = pcVar8;
      if (__n_01 < pcVar8) {
        pcVar7 = __n_01;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace(&local_88,0,local_88._M_string_length,pcVar9,(size_type)pcVar7);
      pcVar7 = pcVar8 + 1;
      if (__n_01 <= pcVar8) goto LAB_0022eacb;
      __n_01 = __n_01 + -(long)pcVar7;
      pcVar9 = pcVar9 + (long)pcVar7;
      this = &local_d0;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (this,0,this->_M_string_length,pcVar9,(size_type)__n_01);
  }
  if (vVar2 == post) {
    iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&local_1a0,"delete");
    if ((iVar5 == 0) ||
       (iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(&local_1a0,"remove"), iVar5 == 0)) {
      command = REMOVE;
    }
    else {
      iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_1a0,"create");
      if (iVar5 == 0) {
        command = CREATE;
      }
      else {
        iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(&local_1a0,"query");
        if ((iVar5 == 0) ||
           (iVar5 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              (&local_1a0,"search"), iVar5 == 0)) {
          command = QUERY;
        }
        else {
          iVar5 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            (&local_1a0,"command");
          if (iVar5 != 0) goto LAB_0022e801;
          command = COMMAND;
        }
      }
    }
    local_1a0._M_string_length = 0;
    *local_1a0._M_dataplus._M_p = '\0';
  }
LAB_0022e801:
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_1a0._M_dataplus._M_p,
             local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
  local_40 = local_d0._M_string_length;
  paStack_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_d0._M_dataplus._M_p;
  query_00._M_str = local_d0._M_dataplus._M_p;
  query_00._M_len = local_d0._M_string_length;
  target_00._M_str = local_88._M_dataplus._M_p;
  target_00._M_len = local_88._M_string_length;
  generateResults(&local_b0,command,&local_60,target_00,query_00,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_b0.first == BAD_REQUEST) {
    why_01._M_str = local_b0.second._M_dataplus._M_p;
    why_01._M_len = local_b0.second._M_string_length;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_150,&local_158,why_01);
    HttpSession::send_lambda::operator()(send,&local_150);
  }
  else if (local_b0.first == NOT_FOUND) {
    why_00._M_str = local_b0.second._M_dataplus._M_p;
    why_00._M_len = local_b0.second._M_string_length;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_150,&local_68,why_00);
    HttpSession::send_lambda::operator()(send,&local_150);
  }
  else if (local_b0.second._M_string_length == 0) {
    content_type_03._M_str = "text/html";
    content_type_03._M_len = 9;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()
              (&local_150,&local_1a8,
               &handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                ::index_page_abi_cxx11_,content_type_03);
    HttpSession::send_lambda::operator()(send,&local_150);
  }
  else if (*local_b0.second._M_dataplus._M_p == '{') {
    content_type_02._M_str = "application/json";
    content_type_02._M_len = 0x10;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_150,&local_1a8,&local_b0.second,content_type_02);
    HttpSession::send_lambda::operator()(send,&local_150);
  }
  else {
    content_type_04._M_str = "text/plain";
    content_type_04._M_len = 10;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_150,&local_1a8,&local_b0.second,content_type_04);
    HttpSession::send_lambda::operator()(send,&local_150);
  }
  boost::beast::http::
  message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message(&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.second._M_dataplus._M_p != &local_b0.second.field_2) {
    operator_delete(local_b0.second._M_dataplus._M_p,
                    local_b0.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,
                    CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                             local_1a0.field_2._M_local_buf[0]) + 1);
  }
  boost::container::
  vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
  ::~vector((vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
             *)&local_170);
  return;
}

Assistant:

void handle_request(http::request<Body, http::basic_fields<Allocator>>&& req, Send&& send)
{
    static const std::string index_page = generateIndexPage();
    // Returns a bad request response
    auto const bad_request = [&req](std::string_view why) {
        http::response<http::string_body> res{http::status::bad_request, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, "text/html");
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");

        res.body() = std::string(why);
        res.prepare_payload();
        return res;
    };

    // Returns a bad request response
    auto const not_found = [&req](std::string_view why) {
        http::response<http::string_body> res{http::status::not_found, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, "text/html");
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");

        res.body() = std::string(why);
        res.prepare_payload();
        return res;
    };

    // generate a conversion response
    auto const response_ok = [&req](const std::string& resp, std::string_view content_type) {
        http::response<http::string_body> res{http::status::ok, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, content_type);
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");
        res.set(http::field::access_control_allow_methods, "*");
        res.set(http::field::access_control_allow_headers, "*");

        if (req.method() != http::verb::head) {
            res.body() = resp;
            res.prepare_payload();
        } else {
            res.set(http::field::content_length, std::to_string(resp.size()));
        }
        return res;
    };

    RestCommand command{RestCommand::QUERY};

    auto method = req.method();
    switch (method) {
        case http::verb::head:
        case http::verb::search:
        case http::verb::get:
            break;
        case http::verb::post:
        case http::verb::put:
            command = RestCommand::CREATE;
            break;
        case http::verb::delete_:
            command = RestCommand::REMOVE;
            break;
        case http::verb::options:
            return send(response_ok("{\"success\":true}", "application/json"));
        default:
            return send(bad_request("Unknown HTTP-method"));
    }

    const std::string_view target(req.target());
    auto psize = req.payload_size();
    if (target == "/index.html" || target == "index.html" ||
        (target == "/" && (!psize || *psize < 4))) {
        return send(response_ok(index_page, "text/html"));
    }

    if (target == "/healthcheck" || target == "healthcheck") {
        return send(response_ok("{\"success\":true}", "application/json"));
    }

    auto reqpr = processRequestParameters(target, req.body());
    std::string brokerName;
    std::string query;
    std::string targetObj;

    partitionTarget(reqpr.first, brokerName, query, targetObj);

    if (method == http::verb::post) {
        if (brokerName == "delete" || brokerName == "remove") {
            command = RestCommand::REMOVE;
            brokerName.clear();
        } else if (brokerName == "create") {
            command = RestCommand::CREATE;
            brokerName.clear();
        } else if (brokerName == "query" || brokerName == "search") {
            command = RestCommand::QUERY;
            brokerName.clear();
        } else if (brokerName == "command") {
            command = RestCommand::COMMAND;
            brokerName.clear();
        }
    }
    auto res = generateResults(command, brokerName, targetObj, query, reqpr.second);
    switch (res.first) {
        case RequestReturnVal::BAD_REQUEST:
            return send(bad_request(res.second));
        case RequestReturnVal::NOT_FOUND:
            return send(not_found(res.second));
        case RequestReturnVal::OK:
        default:
            if (res.second.empty()) {
                return send(response_ok(index_page, "text/html"));
            }
            if (res.second.front() == '{') {
                return send(response_ok(res.second, "application/json"));
            }
            return send(response_ok(res.second, "text/plain"));
    }
}